

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.cpp
# Opt level: O0

const_iterator __thiscall Disa::Matrix_Sparse::end(Matrix_Sparse *this)

{
  size_t i_row;
  Matrix_Sparse *this_local;
  
  i_row = size_row(this);
  Iterator_Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::Iterator_Matrix_Sparse_Row
            ((Iterator_Matrix_Sparse_Row<const_Disa::Matrix_Sparse> *)&this_local,i_row,this);
  return (const_iterator)_this_local;
}

Assistant:

Matrix_Sparse::const_iterator Matrix_Sparse::end() const noexcept {
  return {size_row(), this};
}